

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

Expression *
lossless_neural_sound::expression_compiler::expression::operator+(Expression l,Expression r)

{
  Nodes *pNVar1;
  Expression_node *pEVar2;
  Expression *in_RDI;
  Arena *pAVar3;
  Arena *arena;
  Expression_node *local_38;
  Expression_node *local_30;
  
  pAVar3 = r.arena;
  arena = l.arena;
  if (l.arena == (Arena *)0x0 && r.arena == (Arena *)0x0) {
    in_RDI->arena = (Arena *)0x0;
    in_RDI->nodes = (Nodes *)0x0;
    in_RDI->node = (Expression_node *)0x0;
    in_RDI->constant_value = l.constant_value + r.constant_value;
  }
  else {
    if (l.arena == (Arena *)0x0) {
      Expression::get(&l,r.arena,r.nodes);
      arena = l.arena;
    }
    else if (r.arena == (Arena *)0x0) {
      Expression::get(&r,l.arena,l.nodes);
      pAVar3 = r.arena;
    }
    pNVar1 = l.nodes;
    if ((arena != pAVar3) || (l.nodes != r.nodes)) {
      __assert_fail("l.is_compatible(r)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                    ,0x5c2,
                    "Expression lossless_neural_sound::expression_compiler::expression::operator+(Expression, Expression)"
                   );
    }
    local_38 = l.node;
    local_30 = r.node;
    pEVar2 = Sum::make(arena,l.nodes,&local_38,2);
    in_RDI->arena = arena;
    in_RDI->nodes = pNVar1;
    in_RDI->node = pEVar2;
  }
  return in_RDI;
}

Assistant:

Expression operator+(Expression l, Expression r)
    {
        if(!l.arena && !r.arena)
            return l.constant_value + r.constant_value;
        if(!l.arena)
            l.get(*r.arena, *r.nodes);
        else if(!r.arena)
            r.get(*l.arena, *l.nodes);
        assert(l.is_compatible(r));
        return Expression(*l.arena, *l.nodes, Sum::make(*l.arena, *l.nodes, {l.node, r.node}));
    }